

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

char * soul::heart::ProcessorProperty::getPropertyName(Property p)

{
  char *pcStack_10;
  Property p_local;
  
  if (p == period) {
    pcStack_10 = "period";
  }
  else if (p == frequency) {
    pcStack_10 = "frequency";
  }
  else if (p == id) {
    pcStack_10 = "id";
  }
  else if (p == session) {
    pcStack_10 = "session";
  }
  else {
    if (p != latency) {
      throwInternalCompilerError("getPropertyName",0x569);
    }
    pcStack_10 = "latency";
  }
  return pcStack_10;
}

Assistant:

static const char* getPropertyName (Property p)
        {
            if (p == Property::period)     return "period";
            if (p == Property::frequency)  return "frequency";
            if (p == Property::id)         return "id";
            if (p == Property::session)    return "session";
            if (p == Property::latency)    return "latency";

            SOUL_ASSERT_FALSE;
            return "";
        }